

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnAssignment
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId,
          RegMask allocableRegs)

{
  uint **ppuVar1;
  uint **ppuVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  WorkToPhysMap *pWVar7;
  PhysToWorkMap *pPVar8;
  PhysToWorkMap *pPVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  RegGroup RVar13;
  uint32_t homeId;
  uint uVar14;
  Error EVar15;
  uint32_t uVar16;
  RABlock *pRVar17;
  BaseNode *pBVar18;
  uint uVar19;
  ulong uVar20;
  uint extraout_EDX;
  uint uVar21;
  RABlock *block;
  uint uVar22;
  ulong unaff_RBX;
  ulong unaff_RBP;
  undefined7 in_register_00000031;
  BaseNode *pBVar23;
  InstNode *node;
  BaseCompiler *pBVar24;
  RALocalAllocator *this_00;
  undefined4 in_register_00000084;
  uint *puVar25;
  long in_R9;
  long lVar26;
  ulong uVar27;
  ulong unaff_R12;
  InstNode *pIVar28;
  uint uVar29;
  long lVar30;
  bool bVar31;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  long lStack_c0;
  ulong uStack_b8;
  InstNode *pIStack_b0;
  RALocalAllocator *pRStack_a8;
  long lStack_a0;
  code *pcStack_98;
  ulong uStack_88;
  RALocalAllocator *pRStack_80;
  InstNode *pIStack_78;
  BaseNode *pBStack_70;
  ulong uStack_68;
  ulong uStack_60;
  
  puVar25 = (uint *)CONCAT44(in_register_00000084,allocableRegs);
  pBVar23 = (BaseNode *)CONCAT71(in_register_00000031,group);
  uVar20 = (ulong)physId;
  if (allocableRegs == 0) {
    decideOnAssignment();
LAB_00123782:
    decideOnAssignment();
  }
  else {
    if (*(uint *)&this->_pass->field_0x148 <= workId) goto LAB_00123782;
    uVar20 = *(ulong *)(*(long *)&this->_pass->_workRegs + (ulong)workId * 8);
    bVar3 = *(byte *)(uVar20 + 0x4a);
    if ((bVar3 != 0xff) && ((allocableRegs >> (bVar3 & 0x1f) & 1) != 0)) {
      return (uint)bVar3;
    }
    if (group < kPC) {
      uVar14 = *(uint *)(uVar20 + 0x3c) & allocableRegs;
      if (uVar14 == 0) {
        uVar14 = allocableRegs;
      }
      uVar19 = ~(this->_funcPreservedRegs)._masks._data[group] & uVar14;
      if (uVar19 == 0) {
        uVar19 = uVar14;
      }
      uVar16 = 0;
      if (uVar19 == 0) {
        return 0;
      }
      for (; (uVar19 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
      return uVar16;
    }
  }
  uVar14 = (uint)uVar20;
  decideOnAssignment();
  uVar19 = (uint)puVar25;
  if (uVar19 == 0) {
    decideOnReassignment();
LAB_0012385b:
    decideOnReassignment();
  }
  else {
    if (*(uint *)&this->_pass->field_0x148 <= extraout_EDX) goto LAB_0012385b;
    lVar30 = *(long *)(*(long *)&this->_pass->_workRegs + (ulong)extraout_EDX * 8);
    bVar3 = *(byte *)(lVar30 + 0x4a);
    if ((bVar3 != 0xff) && ((uVar19 >> (bVar3 & 0x1f) & 1) != 0)) {
      return (uint)bVar3;
    }
    uVar14 = extraout_EDX;
    if ((byte)pBVar23 < 4) {
      bVar3 = *(byte *)(in_R9 + 0x18 + ((ulong)pBVar23 & 0xff));
      if (bVar3 != 0) {
        uVar14 = *(uint *)(in_R9 + 0x14) >> ((byte)pBVar23 * '\b' & 0x1f) & 0xff;
        lVar26 = 0;
        do {
          if (*(uint *)((ulong)(uVar14 << 5) + in_R9 + 0x4c + lVar26) == extraout_EDX) {
            if ((*(uint *)(lVar26 + 0x54 + (ulong)(uVar14 << 5) + in_R9) & 0x40008) != 0) {
              uVar16 = 0;
              if (uVar19 == 0) {
                return 0;
              }
              for (; (uVar19 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
              return uVar16;
            }
            break;
          }
          lVar26 = lVar26 + 0x20;
        } while ((ulong)bVar3 * 0x20 != lVar26);
      }
      if ((*(byte *)(lVar30 + 0x24) & 4) != 0) {
        return 0xff;
      }
      uVar19 = ~*(uint *)(lVar30 + 0x38) & uVar19;
      if (uVar19 == 0) {
        return 0xff;
      }
      uVar14 = ~(this->_funcPreservedRegs)._masks._data[(ulong)pBVar23 & 0xff] & uVar19;
      if (uVar14 == 0) {
        uVar14 = uVar19;
      }
      uVar16 = 0;
      if (uVar14 == 0) {
        return 0;
      }
      for (; (uVar14 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
      }
      return uVar16;
    }
  }
  decideOnReassignment();
  if (uVar14 == 0) {
LAB_00123944:
    decideOnSpillFor();
  }
  else if ((byte)pBVar23 < 4) {
    uVar19 = 0;
    if (uVar14 != 0) {
      for (; (uVar14 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
      }
    }
    uVar27 = (ulong)pBVar23 & 0xff;
    pBVar23 = (BaseNode *)(this->_curAssignment)._physToWorkIds._data[uVar27];
    uVar21 = *(uint *)(pBVar23 + (ulong)uVar19 * 4);
    uVar20 = (ulong)uVar21;
    uVar14 = uVar14 - 1 & uVar14;
    if (uVar14 == 0) {
LAB_00123933:
      *puVar25 = uVar21;
      return uVar19;
    }
    uVar4 = *(uint *)&this->_pass->field_0x148;
    if (uVar21 < uVar4) {
      lVar30 = *(long *)&this->_pass->_workRegs;
      uVar22 = (uint)(*(float *)(*(long *)(lVar30 + uVar20 * 8) + 100) * 1048576.0);
      uVar5 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[uVar27];
      this = (RALocalAllocator *)(ulong)uVar5;
      uVar21 = uVar22 + 0x40000;
      if ((uVar5 >> (uVar19 & 0x1f) & 1) == 0) {
        uVar21 = uVar22;
      }
      uVar27 = (ulong)uVar21;
      do {
        uVar22 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        unaff_RBX = (ulong)uVar22;
        uVar21 = *(uint *)(pBVar23 + unaff_RBX * 4);
        if (uVar4 <= uVar21) {
          decideOnSpillFor();
          goto LAB_00123944;
        }
        uVar29 = (uint)(*(float *)(*(long *)(lVar30 + (ulong)uVar21 * 8) + 100) * 1048576.0);
        uVar12 = uVar29 + 0x40000;
        if ((uVar5 >> (uVar22 & 0x1f) & 1) == 0) {
          uVar12 = uVar29;
        }
        unaff_R12 = (ulong)uVar12;
        bVar31 = uVar12 < (uint)uVar27;
        if (bVar31) {
          uVar20 = (ulong)uVar21;
          uVar27 = unaff_R12;
        }
        uVar21 = (uint)uVar20;
        if (bVar31) {
          uVar19 = uVar22;
        }
        uVar14 = uVar14 - 1 & uVar14;
        unaff_RBP = (ulong)uVar14;
      } while (uVar14 != 0);
      goto LAB_00123933;
    }
    goto LAB_0012394e;
  }
  decideOnSpillFor();
LAB_0012394e:
  decideOnSpillFor();
  lVar30 = *(long *)(pBVar23 + 0x20);
  node = (InstNode *)(ulong)*(uint *)(lVar30 + 0x10);
  if (node != (InstNode *)0x0) {
    pRStack_80 = (RALocalAllocator *)&this->_curAssignment;
    lVar26 = lVar30 + 0x54;
    pIVar28 = (InstNode *)0x0;
    this_00 = this;
    pIStack_78 = node;
    pBStack_70 = pBVar23;
    uStack_68 = unaff_RBX;
    uStack_60 = unaff_R12;
    do {
      if ((InstNode *)(ulong)*(uint *)(lVar30 + 0x10) <= pIVar28) {
        pcStack_98 = (code *)0x123a70;
        spillAfterAllocation();
LAB_00123a70:
        pcStack_98 = (code *)0x123a75;
        spillAfterAllocation();
LAB_00123a75:
        pcStack_98 = (code *)0x123a7a;
        spillAfterAllocation();
LAB_00123a7a:
        pcStack_98 = (code *)0x123a7f;
        spillAfterAllocation();
LAB_00123a7f:
        pcStack_98 = allocBranch;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
        lStack_c0 = lVar26;
        uStack_b8 = unaff_R12;
        pIStack_b0 = pIVar28;
        pRStack_a8 = this;
        lStack_a0 = lVar30;
        pcStack_98 = (code *)unaff_RBP;
        if ((*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) &&
           (EVar15 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                        (ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true),
           EVar15 != 0)) {
          return EVar15;
        }
        EVar15 = allocInst(this_00,node);
        if (EVar15 != 0) {
          return EVar15;
        }
        uVar14 = *(uint *)(block + 0xb8);
        if ((ulong)uVar14 == 0xffffffff) {
          pRVar17 = block + 0xbc;
LAB_00123b18:
          EVar15 = spillScratchGpRegsBeforeEntry(this_00,*(RegMask *)pRVar17);
          if (EVar15 != 0) {
            return EVar15;
          }
          if (*(long *)(block + 200) == 0) {
            EVar15 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar15 != 0) {
              return EVar15;
            }
          }
          else {
            pBVar23 = *(BaseNode **)this_00->_pass->_extraBlock;
            pBVar18 = BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,pBVar23);
            pWVar7 = (this_00->_curAssignment)._workToPhysMap;
            memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap
                   ,(ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
            memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar7,
                   (ulong)(this_00->_tmpAssignment)._layout.workCount);
            EVar15 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                        (ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
            if (EVar15 != 0) {
              return EVar15;
            }
            pBVar24 = this_00->_cc;
            if ((pBVar24->super_BaseBuilder)._cursor != pBVar23) {
              if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_00123cba;
              lVar30 = (ulong)((byte)node[0x12] - 1) * 0x10;
              if ((*(uint *)(node + lVar30 + 0x40) & 7) != 5) goto LAB_00123cbf;
              (*(pBVar24->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_e8);
              uStack_d8 = *(undefined8 *)(node + lVar30 + 0x40);
              uStack_d0 = *(undefined8 *)(node + lVar30 + 0x48);
              *(undefined4 *)(node + lVar30 + 0x40) = uStack_e8;
              *(undefined4 *)(node + lVar30 + 0x44) = uStack_e4;
              *(undefined4 *)(node + lVar30 + 0x48) = uStack_e0;
              *(undefined4 *)(node + lVar30 + 0x4c) = uStack_dc;
              node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
              uVar16 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
              if (uVar16 != 0) {
                return uVar16;
              }
              pBVar24 = this_00->_cc;
              (pBVar24->super_BaseBuilder)._cursor = pBVar23;
              (*(pBVar24->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar24,&uStack_e8);
              pBVar24 = this_00->_cc;
            }
            (pBVar24->super_BaseBuilder)._cursor = pBVar18;
            pWVar7 = (this_00->_curAssignment)._workToPhysMap;
            pPVar8 = (this_00->_curAssignment)._physToWorkMap;
            pPVar9 = (this_00->_tmpAssignment)._physToWorkMap;
            (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
            (this_00->_curAssignment)._physToWorkMap = pPVar9;
            (this_00->_tmpAssignment)._workToPhysMap = pWVar7;
            (this_00->_tmpAssignment)._physToWorkMap = pPVar8;
            lVar30 = 0;
            do {
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar30;
              puVar25 = *ppuVar1;
              puVar10 = ppuVar1[1];
              ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar30;
              puVar11 = ppuVar2[1];
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar30;
              *ppuVar1 = *ppuVar2;
              ppuVar1[1] = puVar11;
              ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar30;
              *ppuVar1 = puVar25;
              ppuVar1[1] = puVar10;
              lVar30 = lVar30 + 2;
            } while (lVar30 != 4);
          }
          uVar16 = 0;
        }
        else {
          if (uVar14 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar17 = (RABlock *)((ulong)uVar14 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_00123b18;
          }
          allocBranch();
LAB_00123cba:
          allocBranch();
LAB_00123cbf:
          uVar16 = 3;
        }
        return uVar16;
      }
      if ((*(byte *)(lVar26 + 2) & 2) != 0) {
        uVar14 = *(uint *)(lVar26 + -8);
        unaff_R12 = (ulong)uVar14;
        if (*(uint *)&this->_pass->field_0x148 <= uVar14) goto LAB_00123a70;
        lVar6 = *(long *)(*(long *)&this->_pass->_workRegs + unaff_R12 * 8);
        if (*(char *)(lVar6 + 0x4a) != -1) goto LAB_00123a4a;
        if ((this->_curAssignment)._layout.workCount <= uVar14) goto LAB_00123a75;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_RBP = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_00123a4a;
        RVar13 = *(RegGroup *)(lVar6 + 0x21);
        (this->_cc->super_BaseBuilder)._cursor = pBStack_70;
        if (0x1f < bVar3) goto LAB_00123a7a;
        RVar13 = RVar13 & kMaxValue;
        if (RVar13 < kPC) {
          if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[RVar13] >>
               (bVar3 & 0x1f) & 1) != 0) {
            pcStack_98 = (code *)0x123a2d;
            uStack_88 = (ulong)RVar13;
            EVar15 = onSaveReg(this,RVar13,uVar14,(uint)bVar3);
            RVar13 = (RegGroup)uStack_88;
            if (EVar15 != 0) {
              return EVar15;
            }
          }
          pcStack_98 = (code *)0x123a45;
          this_00 = pRStack_80;
          RAAssignment::unassign((RAAssignment *)pRStack_80,RVar13,uVar14,(uint)bVar3);
          node = pIStack_78;
          goto LAB_00123a4a;
        }
        goto LAB_00123a7f;
      }
LAB_00123a4a:
      pIVar28 = pIVar28 + 1;
      lVar26 = lVar26 + 0x20;
    } while (node != pIVar28);
  }
  return 0;
}

Assistant:

uint32_t RALocalAllocator::decideOnAssignment(RegGroup group, uint32_t workId, uint32_t physId, RegMask allocableRegs) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(group, physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer home register id, if possible.
  if (workReg->hasHomeRegId()) {
    uint32_t homeId = workReg->homeRegId();
    if (Support::bitTest(allocableRegs, homeId)) {
      return homeId;
    }
  }

  // Prefer registers used upon block entries.
  RegMask previouslyAssignedRegs = workReg->allocatedMask();
  if (allocableRegs & previouslyAssignedRegs) {
    allocableRegs &= previouslyAssignedRegs;
  }

  return pickBestSuitableRegister(group, allocableRegs);
}